

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerTypes.h
# Opt level: O0

size_t __thiscall
ContextSpecificHolder<Boolean,_(unsigned_char)'\xa4',_(OptionType)0>::EncodedSize
          (ContextSpecificHolder<Boolean,_(unsigned_char)__xa4_,_(OptionType)0> *this)

{
  size_t sVar1;
  ContextSpecificHolder<Boolean,_(unsigned_char)__xa4_,_(OptionType)0> *this_local;
  
  sVar1 = DerBase::GetcbData((DerBase *)this);
  if (sVar1 == 0) {
    this_local = (ContextSpecificHolder<Boolean,_(unsigned_char)__xa4_,_(OptionType)0> *)0x0;
  }
  else {
    this_local = (ContextSpecificHolder<Boolean,_(unsigned_char)__xa4_,_(OptionType)0> *)
                 DerBase::EncodedSize((DerBase *)this);
  }
  return (size_t)this_local;
}

Assistant:

size_t EncodedSize() 
	{
		if (innerType.GetcbData() == 0)
			return 0;

		return innerType.EncodedSize(); 
	}